

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestSplitOnBorder(void)

{
  bool bVar1;
  char *pcVar2;
  streambuf *this;
  OutputBuffer *src;
  OutputBuffer newBuf;
  size_t in;
  istream is;
  scoped_array<char> datain;
  size_t bufsize;
  OutputBuffer tmp;
  size_t firstChunkSize;
  OutputBuffer buf;
  string part2;
  string part1;
  lazy_ostream *in_stack_fffffffffffffa98;
  basic_cstring<const_char> *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  begin *in_stack_fffffffffffffab0;
  OutputBuffer *in_stack_fffffffffffffab8;
  OutputBuffer *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  allocator<char> *in_stack_fffffffffffffad0;
  lazy_ostream *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  size_t line_num;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  lazy_ostream *in_stack_fffffffffffffaf0;
  begin *in_stack_fffffffffffffb08;
  unit_test_log_t *in_stack_fffffffffffffb10;
  basic_cstring<const_char> local_430;
  basic_cstring<const_char> local_420;
  undefined1 local_410 [56];
  basic_cstring<const_char> local_3d8;
  undefined4 local_3c8;
  int local_3c4;
  InputBuffer *in_stack_fffffffffffffc40;
  undefined1 local_3b0 [56];
  basic_cstring<const_char> local_378;
  fpos local_368 [32];
  basic_cstring<const_char> local_348;
  undefined1 local_338 [56];
  basic_cstring<const_char> local_300;
  long local_2f0;
  char local_2e8 [400];
  scoped_array<char> local_158;
  size_type local_150;
  undefined1 local_148 [24];
  undefined1 local_130 [56];
  basic_cstring<const_char> local_f8 [3];
  basic_cstring<const_char> local_c8;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffffab0,(const_string *)in_stack_fffffffffffffaa8,
             (size_t)in_stack_fffffffffffffaa0);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffffaa8,
             (log_level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffffaa8,(char (*) [18])in_stack_fffffffffffffaa0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]> *)
             0x236fd4);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffffaa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  std::allocator<char>::~allocator(&local_a9);
  avro::OutputBuffer::OutputBuffer(in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffaa0,(data_type *)in_stack_fffffffffffffa98,
             0x2370b6);
  local_c8.m_begin = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x2370c5);
  avro::OutputBuffer::OutputBuffer(in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffaa0,(data_type *)in_stack_fffffffffffffa98,
             0x237134);
  avro::OutputBuffer::append<avro::OutputBuffer>
            ((OutputBuffer *)in_stack_fffffffffffffab0,(OutputBuffer *)in_stack_fffffffffffffaa8);
  avro::InputBuffer::InputBuffer((InputBuffer *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  printBuffer(in_stack_fffffffffffffc40);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x237180);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23718d);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffaa0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffaf0,
               (const_string *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (size_t)in_stack_fffffffffffffae0,(const_string *)in_stack_fffffffffffffad8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffaa8,(char (*) [1])in_stack_fffffffffffffaa0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_148 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_148._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x23723f);
    local_148._0_4_ = 2;
    in_stack_fffffffffffffaa8 = "2";
    in_stack_fffffffffffffaa0 = (basic_cstring<const_char> *)local_148;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_130,local_148 + 8,0x319,1,2,local_148 + 4,"buf.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2372c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_150 = avro::OutputBuffer::size((OutputBuffer *)0x2372ed);
  pcVar2 = (char *)operator_new__((ulong)local_c8.m_begin);
  boost::scoped_array<char>::scoped_array(&local_158,pcVar2);
  avro::istream::istream
            ((istream *)in_stack_fffffffffffffab0,(OutputBuffer *)in_stack_fffffffffffffaa8);
  pcVar2 = boost::scoped_array<char>::operator[](&local_158,0);
  local_2f0 = std::istream::readsome(local_2e8,(long)pcVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffaa0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffaf0,
               (const_string *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (size_t)in_stack_fffffffffffffae0,(const_string *)in_stack_fffffffffffffad8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffaa8,(char (*) [1])in_stack_fffffffffffffaa0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_fffffffffffffaa8 = "firstChunkSize";
    in_stack_fffffffffffffaa0 = &local_c8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_338,&local_348,799,1,2,&local_2f0,"in");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x237492);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::OutputBuffer(in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
  avro::istream::getBuffer((istream *)0x2374d1);
  avro::OutputBuffer::append<avro::InputBuffer>
            ((OutputBuffer *)in_stack_fffffffffffffab0,(InputBuffer *)in_stack_fffffffffffffaa8);
  local_368._0_16_ = std::istream::tellg();
  std::fpos::operator_cast_to_long(local_368);
  avro::OutputBuffer::discardData
            ((OutputBuffer *)in_stack_fffffffffffffad0,
             CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffaa0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffaf0,
               (const_string *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (size_t)in_stack_fffffffffffffae0,(const_string *)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffaf0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffaa8,(char (*) [1])in_stack_fffffffffffffaa0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffc40,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_fffffffffffffaec = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x2375f5);
    local_3c8 = 1;
    in_stack_fffffffffffffaa8 = "1";
    in_stack_fffffffffffffaa0 = (basic_cstring<const_char> *)&local_3c8;
    local_3c4 = in_stack_fffffffffffffaec;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_3b0,&stack0xfffffffffffffc40,0x324,1,2,&local_3c4,"newBuf.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x237671);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffffae8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffae8);
  } while (bVar1);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffaa0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffaf0,
               (const_string *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               line_num,(const_string *)in_stack_fffffffffffffad8);
    in_stack_fffffffffffffad8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffaa8,(char (*) [1])in_stack_fffffffffffffaa0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_430.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x237732);
    local_430.m_begin = (iterator)(local_150 - local_2f0);
    in_stack_fffffffffffffaa8 = "bufsize - in";
    in_stack_fffffffffffffaa0 = &local_430;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_410,&local_420,0x326,1,2,&local_430.m_end,"newBuf.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2377c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  this = (streambuf *)std::ios::rdbuf();
  src = (OutputBuffer *)std::ostream::operator<<(&std::cout,this);
  std::ostream::operator<<(src,std::endl<char,std::char_traits<char>>);
  avro::InputBuffer::InputBuffer((InputBuffer *)this,src);
  printBuffer(in_stack_fffffffffffffc40);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x237858);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x237865);
  avro::istream::~istream((istream *)in_stack_fffffffffffffaa0);
  boost::scoped_array<char>::~scoped_array((scoped_array<char> *)0x23787f);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23788c);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestSplitOnBorder()
{
    BOOST_TEST_MESSAGE( "TestSplitOnBorder");
    {

        const std::string part1 = "This message";
        const std::string part2 = " is to be split";

        avro::OutputBuffer buf;
        buf.writeTo(part1.c_str(), part1.size()); 
        size_t firstChunkSize = buf.size();

        {
            avro::OutputBuffer tmp;
            tmp.writeTo(part2.c_str(), part2.size()); 
            buf.append(tmp);
            printBuffer(InputBuffer(buf));
        }

        BOOST_CHECK_EQUAL(buf.numDataChunks(), 2);
        size_t bufsize = buf.size();
    
        boost::scoped_array<char> datain(new char[firstChunkSize]);
        avro::istream is(buf);
        size_t in = static_cast<size_t>(is.readsome(&datain[0], firstChunkSize));
        BOOST_CHECK_EQUAL(in, firstChunkSize);

        OutputBuffer newBuf;
        newBuf.append(is.getBuffer());
        newBuf.discardData(static_cast<size_t>(is.tellg()));
        BOOST_CHECK_EQUAL(newBuf.numDataChunks(), 1);

        BOOST_CHECK_EQUAL(newBuf.size(), bufsize - in);

        cout << is.rdbuf() << endl;
        printBuffer(newBuf);
    }
}